

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::interpolateWeights
               (TexelWeightPair *dst,deUint32 (*unquantizedWeights) [64],int blockWidth,
               int blockHeight,ASTCBlockMode *blockMode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  deUint32 p11;
  deUint32 p10;
  deUint32 p01;
  deUint32 p00;
  int texelWeightNdx;
  deUint32 i11;
  deUint32 i10;
  deUint32 i01;
  deUint32 i00;
  deUint32 w00;
  deUint32 w01;
  deUint32 w10;
  deUint32 w11;
  deUint32 fY;
  deUint32 fX;
  deUint32 jY;
  deUint32 jX;
  deUint32 gY;
  deUint32 gX;
  int texelX;
  int texelY;
  deUint32 scaleY;
  deUint32 scaleX;
  int numWeightsPerTexel;
  ASTCBlockMode *blockMode_local;
  int blockHeight_local;
  int blockWidth_local;
  deUint32 (*unquantizedWeights_local) [64];
  TexelWeightPair *dst_local;
  
  iVar3 = 1;
  if ((blockMode->isDualPlane & 1U) != 0) {
    iVar3 = 2;
  }
  for (gX = 0; (int)gX < blockHeight; gX = gX + 1) {
    for (gY = 0; (int)gY < blockWidth; gY = gY + 1) {
      uVar4 = ((blockWidth / 2 + 0x400) / (blockWidth + -1)) * gY *
              (blockMode->weightGridWidth + -1) + 0x20;
      uVar5 = ((blockHeight / 2 + 0x400) / (blockHeight + -1)) * gX *
              (blockMode->weightGridHeight + -1) + 0x20;
      uVar6 = uVar4 >> 6 & 0xf;
      uVar7 = uVar5 >> 6 & 0xf;
      uVar8 = uVar6 * uVar7 + 8 >> 4;
      iVar9 = (uVar5 >> 10) * blockMode->weightGridWidth + (uVar4 >> 10);
      iVar1 = blockMode->weightGridWidth;
      iVar2 = blockMode->weightGridWidth;
      for (p01 = 0; (int)p01 < iVar3; p01 = p01 + 1) {
        dst[(int)(gX * blockWidth + gY)].w[(int)p01] =
             (*unquantizedWeights)[iVar9 * iVar3 + p01 & 0x3f] * (((0x10 - uVar6) - uVar7) + uVar8)
             + (*unquantizedWeights)[(iVar9 + 1) * iVar3 + p01 & 0x3f] * (uVar6 - uVar8) +
             (*unquantizedWeights)[(iVar9 + iVar1) * iVar3 + p01 & 0x3f] * (uVar7 - uVar8) +
             (*unquantizedWeights)[(iVar9 + iVar2 + 1) * iVar3 + p01 & 0x3f] * uVar8 + 8 >> 4;
      }
    }
  }
  return;
}

Assistant:

void interpolateWeights (TexelWeightPair* dst, const deUint32 (&unquantizedWeights) [64], int blockWidth, int blockHeight, const ASTCBlockMode& blockMode)
{
	const int		numWeightsPerTexel	= blockMode.isDualPlane ? 2 : 1;
	const deUint32	scaleX				= (1024 + blockWidth/2) / (blockWidth-1);
	const deUint32	scaleY				= (1024 + blockHeight/2) / (blockHeight-1);

	DE_ASSERT(blockMode.weightGridWidth*blockMode.weightGridHeight*numWeightsPerTexel <= DE_LENGTH_OF_ARRAY(unquantizedWeights));

	for (int texelY = 0; texelY < blockHeight; texelY++)
	{
		for (int texelX = 0; texelX < blockWidth; texelX++)
		{
			const deUint32 gX	= (scaleX*texelX*(blockMode.weightGridWidth-1) + 32) >> 6;
			const deUint32 gY	= (scaleY*texelY*(blockMode.weightGridHeight-1) + 32) >> 6;
			const deUint32 jX	= gX >> 4;
			const deUint32 jY	= gY >> 4;
			const deUint32 fX	= gX & 0xf;
			const deUint32 fY	= gY & 0xf;

			const deUint32 w11	= (fX*fY + 8) >> 4;
			const deUint32 w10	= fY - w11;
			const deUint32 w01	= fX - w11;
			const deUint32 w00	= 16 - fX - fY + w11;

			const deUint32 i00	= jY*blockMode.weightGridWidth + jX;
			const deUint32 i01	= i00 + 1;
			const deUint32 i10	= i00 + blockMode.weightGridWidth;
			const deUint32 i11	= i00 + blockMode.weightGridWidth + 1;

			// These addresses can be out of bounds, but respective weights will be 0 then.
			DE_ASSERT(deInBounds32(i00, 0, blockMode.weightGridWidth*blockMode.weightGridHeight) || w00 == 0);
			DE_ASSERT(deInBounds32(i01, 0, blockMode.weightGridWidth*blockMode.weightGridHeight) || w01 == 0);
			DE_ASSERT(deInBounds32(i10, 0, blockMode.weightGridWidth*blockMode.weightGridHeight) || w10 == 0);
			DE_ASSERT(deInBounds32(i11, 0, blockMode.weightGridWidth*blockMode.weightGridHeight) || w11 == 0);

			for (int texelWeightNdx = 0; texelWeightNdx < numWeightsPerTexel; texelWeightNdx++)
			{
				// & 0x3f clamps address to bounds of unquantizedWeights
				const deUint32 p00	= unquantizedWeights[(i00 * numWeightsPerTexel + texelWeightNdx) & 0x3f];
				const deUint32 p01	= unquantizedWeights[(i01 * numWeightsPerTexel + texelWeightNdx) & 0x3f];
				const deUint32 p10	= unquantizedWeights[(i10 * numWeightsPerTexel + texelWeightNdx) & 0x3f];
				const deUint32 p11	= unquantizedWeights[(i11 * numWeightsPerTexel + texelWeightNdx) & 0x3f];

				dst[texelY*blockWidth + texelX].w[texelWeightNdx] = (p00*w00 + p01*w01 + p10*w10 + p11*w11 + 8) >> 4;
			}
		}
	}
}